

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

int __thiscall QIODevice::open(QIODevice *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  QIODevicePrivate *this_00;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QIODevicePrivate *d;
  OpenModeFlag in_stack_ffffffffffffffbc;
  QVLABase<QRingBuffer> *in_stack_ffffffffffffffc0;
  QIODevicePrivate *this_01;
  QIODevicePrivate *this_02;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_10;
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (Int)__file;
  this_00 = d_func((QIODevice *)0x2c2d5e);
  (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_c;
  local_10.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       QFlags<QIODeviceBase::OpenModeFlag>::operator&
                 ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffbc);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
  if (bVar1) {
    iVar2 = (*(this->super_QObject)._vptr_QObject[0x10])();
    this_01 = (QIODevicePrivate *)CONCAT44(extraout_var,iVar2);
  }
  else {
    this_01 = (QIODevicePrivate *)0x0;
  }
  iVar2 = (int)((ulong)this >> 0x20);
  this_00->pos = (qint64)this_01;
  this_00->accessMode = Unset;
  QVLABase<QRingBuffer>::clear(in_stack_ffffffffffffffc0);
  QVLABase<QRingBuffer>::clear(in_stack_ffffffffffffffc0);
  this_02 = this_00;
  isReadable((QIODevice *)this_01);
  QIODevicePrivate::setReadChannelCount(this_02,iVar2);
  iVar2 = (int)((ulong)this_02 >> 0x20);
  isWritable((QIODevice *)this_01);
  QIODevicePrivate::setWriteChannelCount(this_01,iVar2);
  QString::clear((QString *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),1);
  }
  __stack_chk_fail();
}

Assistant:

bool QIODevice::open(QIODeviceBase::OpenMode mode)
{
    Q_D(QIODevice);
    d->openMode = mode;
    d->pos = (mode & Append) ? size() : qint64(0);
    d->accessMode = QIODevicePrivate::Unset;
    d->readBuffers.clear();
    d->writeBuffers.clear();
    d->setReadChannelCount(isReadable() ? 1 : 0);
    d->setWriteChannelCount(isWritable() ? 1 : 0);
    d->errorString.clear();
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::open(0x%x)\n", this, mode.toInt());
#endif
    return true;
}